

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tls-client.c
# Opt level: O1

int lws_ssl_client_connect1(lws *wsi)

{
  lws_ssl_capable_status lVar1;
  
  lVar1 = lws_tls_client_connect(wsi);
  switch(lVar1) {
  case LWS_SSL_CAPABLE_DONE:
    lVar1 = ~LWS_SSL_CAPABLE_MORE_SERVICE_READ;
    break;
  case LWS_SSL_CAPABLE_MORE_SERVICE_WRITE:
    lws_callback_on_writable(wsi);
  case LWS_SSL_CAPABLE_MORE_SERVICE:
  case LWS_SSL_CAPABLE_MORE_SERVICE_READ:
    lwsi_set_state(wsi,0x204);
  default:
    lVar1 = LWS_SSL_CAPABLE_DONE;
    break;
  case LWS_SSL_CAPABLE_ERROR:
    break;
  }
  return lVar1;
}

Assistant:

int
lws_ssl_client_connect1(struct lws *wsi)
{
	int n;

	n = lws_tls_client_connect(wsi);
	switch (n) {
	case LWS_SSL_CAPABLE_ERROR:
		return -1;
	case LWS_SSL_CAPABLE_DONE:
		return 1; /* connected */
	case LWS_SSL_CAPABLE_MORE_SERVICE_WRITE:
		lws_callback_on_writable(wsi);
		/* fallthru */
	case LWS_SSL_CAPABLE_MORE_SERVICE:
	case LWS_SSL_CAPABLE_MORE_SERVICE_READ:
		lwsi_set_state(wsi, LRS_WAITING_SSL);
		break;
	}

	return 0; /* retry */
}